

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_NoiseModelUpdateTest_::UpdateFailsNoFlatBlocks<BitDepthParams<unsigned_short,_8,_true>_>
::TestBody(UpdateFailsNoFlatBlocks<BitDepthParams<unsigned_short,_8,_true>_> *this)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RDI;
  NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_> *unaff_retaddr;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_ffffffffffffffc0;
  anon_enum_32 *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 uVar3;
  Type in_stack_ffffffffffffffec;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffff0;
  
  uVar3 = 2;
  iVar2 = NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_>::NoiseModelUpdate
                    (unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int *)in_stack_ffffffffffffffc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffff0._M_head_impl);
    testing::AssertionResult::failure_message((AssertionResult *)0x5c1a91);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffff0._M_head_impl,in_stack_ffffffffffffffec,
               (char *)CONCAT44(uVar3,iVar2),in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this,
               (Message *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffffc0);
    testing::Message::~Message((Message *)0x5c1add);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c1b2d);
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateFailsNoFlatBlocks) {
  EXPECT_EQ(AOM_NOISE_STATUS_INSUFFICIENT_FLAT_BLOCKS,
            this->NoiseModelUpdate());
}